

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConfigData::~ConfigData(ConfigData *this)

{
  ConfigData *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->testsOrTags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->reporterNames);
  std::__cxx11::string::~string((string *)&this->processName);
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::string::~string((string *)&this->outputFilename);
  return;
}

Assistant:

ConfigData()
			: listTests(false),
			listTags(false),
			listReporters(false),
			listTestNamesOnly(false),
			showSuccessfulTests(false),
			shouldDebugBreak(false),
			noThrow(false),
			showHelp(false),
			showInvisibles(false),
			filenamesAsTags(false),
			abortAfter(-1),
			rngSeed(0),
			verbosity(Verbosity::Normal),
			warnings(WarnAbout::Nothing),
			showDurations(ShowDurations::DefaultForReporter),
			runOrder(RunTests::InDeclarationOrder),
			useColour(UseColour::Auto)
		{}